

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall google::protobuf::RepeatedField<double>::FastAdder::Add(FastAdder *this,double *val)

{
  double dVar1;
  int iVar2;
  RepeatedField<double> *this_00;
  
  iVar2 = this->index_;
  if (iVar2 == this->capacity_) {
    this_00 = this->repeated_field_;
    this_00->current_size_ = iVar2;
    Reserve(this_00,iVar2 + 1);
    this->capacity_ = this->repeated_field_->total_size_;
    this->buffer_ = (double *)this->repeated_field_->arena_or_elements_;
  }
  dVar1 = *val;
  iVar2 = this->index_;
  this->index_ = iVar2 + 1;
  this->buffer_[iVar2] = dVar1;
  return;
}

Assistant:

void Add(const Element& val) {
      if (kIsPod) {
        if (index_ == capacity_) {
          repeated_field_->current_size_ = index_;
          repeated_field_->Reserve(index_ + 1);
          capacity_ = repeated_field_->total_size_;
          buffer_ = repeated_field_->unsafe_elements();
        }
        buffer_[index_++] = val;
      } else {
        repeated_field_->Add(val);
      }
    }